

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64(char *s,size_t len)

{
  uint64_t uVar1;
  char *in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  farmhash64_te(in_RSI,in_stack_ffffffffffffffe8);
  uVar1 = debug_tweak64(0x217855);
  return uVar1;
}

Assistant:

uint64_t farmhash64(const char* s, size_t len) {
  return debug_tweak64(
#if CAN_USE_SSE41 && CAN_USE_SSE42 && x86_64
      farmhash64_te(s, len)
#else
      farmhash64_xo(s, len)
#endif
  );
}